

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

void __thiscall
soplex::SoPlexBase<double>::getRowVectorReal
          (SoPlexBase<double> *this,int i,DSVectorBase<double> *row)

{
  pointer pdVar1;
  bool bVar2;
  SVectorBase<double> *this_00;
  undefined8 in_RDX;
  undefined4 in_ESI;
  SPxLPBase<double> *in_RDI;
  SVectorBase<double> *in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff0;
  
  bVar2 = SPxLPBase<double>::isScaled
                    ((SPxLPBase<double> *)
                     in_RDI[0x10].super_LPRowSetBase<double>.super_SVSetBase<double>.factor);
  if (bVar2) {
    this_00 = SPxLPBase<double>::rowVector(in_RDI,(int)((ulong)in_RDX >> 0x20));
    SVectorBase<double>::size(this_00);
    DSVectorBase<double>::setMax
              ((DSVectorBase<double> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
               (int)((ulong)in_RDX >> 0x20));
    pdVar1 = in_RDI[0x10].super_LPRowSetBase<double>.left.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    (**(code **)((long)*pdVar1 + 0xd0))
              (pdVar1,in_RDI[0x10].super_LPRowSetBase<double>.super_SVSetBase<double>.factor,in_ESI,
               in_RDX);
  }
  else {
    SPxLPBase<double>::rowVector(in_RDI,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
    DSVectorBase<double>::operator=((DSVectorBase<double> *)in_RDI,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void SoPlexBase<R>::getRowVectorReal(int i, DSVectorBase<R>& row) const
{
   assert(_realLP);

   if(_realLP->isScaled())
   {
      assert(_scaler);
      row.setMax(_realLP->rowVector(i).size());
      _scaler->getRowUnscaled(*_realLP, i, row);
   }
   else
      row = _realLP->rowVector(i);
}